

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XNA_Song.c
# Opt level: O2

float XNA_PlaySong(char *name)

{
  void *pBufferContext;
  stb_vorbis *callback;
  float fVar1;
  FAudioWaveFormatEx format;
  
  XNA_SongKill();
  activeSong = stb_vorbis_open_filename(name,(int *)0x0,(stb_vorbis_alloc *)0x0);
  activeSongInfo_0 = activeSong->sample_rate;
  activeSongInfo_1 = activeSong->channels;
  format.wFormatTag = 3;
  format.nChannels = (uint16_t)activeSongInfo_1;
  format.wBitsPerSample = 0x20;
  format.cbSize = 0;
  format.nBlockAlign = (uint16_t)(activeSongInfo_1 << 2);
  format.nAvgBytesPerSec = (activeSongInfo_1 << 2 & 0xffffU) * activeSongInfo_0;
  format.nSamplesPerSec = activeSongInfo_0;
  songCache = (uint8_t *)SDL_malloc();
  SDL_memset(&callbacks,0,0x38);
  callbacks.OnBufferEnd = XNA_SongSubmitBuffer;
  FAudio_CreateSourceVoice
            (songAudio,&songVoice,&format,0,1.0,&callbacks,(FAudioVoiceSends *)0x0,
             (FAudioEffectChain *)0x0);
  pBufferContext = (void *)0x0;
  FAudioVoice_SetVolume(songVoice,songVolume,0);
  callback = activeSong;
  stb_vorbis_seek_start(activeSong);
  XNA_SongSubmitBuffer((FAudioVoiceCallback *)callback,pBufferContext);
  FAudioSourceVoice_Start(songVoice,0,0);
  fVar1 = stb_vorbis_stream_length_in_seconds(activeSong);
  return fVar1;
}

Assistant:

FAUDIOAPI float XNA_PlaySong(const char *name)
{
	FAudioWaveFormatEx format;
	XNA_SongKill();

	activeSong = stb_vorbis_open_filename(name, NULL, NULL);

	/* Set format info */
	activeSongInfo = stb_vorbis_get_info(activeSong);
	format.wFormatTag = FAUDIO_FORMAT_IEEE_FLOAT;
	format.nChannels = activeSongInfo.channels;
	format.nSamplesPerSec = activeSongInfo.sample_rate;
	format.wBitsPerSample = sizeof(float) * 8;
	format.nBlockAlign = format.nChannels * format.wBitsPerSample / 8;
	format.nAvgBytesPerSec = format.nSamplesPerSec * format.nBlockAlign;
	format.cbSize = 0;

	/* Allocate decode cache */
	songCache = (uint8_t*) FAudio_malloc(format.nAvgBytesPerSec);

	/* Init voice */
	FAudio_zero(&callbacks, sizeof(FAudioVoiceCallback));
	callbacks.OnBufferEnd = XNA_SongSubmitBuffer;
	FAudio_CreateSourceVoice(
		songAudio,
		&songVoice,
		&format,
		0,
		1.0f, /* No pitch shifting here! */
		&callbacks,
		NULL,
		NULL
	);
	FAudioVoice_SetVolume(songVoice, songVolume, 0);

	/* Okay, this song is decoding now */
	stb_vorbis_seek_start(activeSong);
	XNA_SongSubmitBuffer(NULL, NULL);

	/* Finally. */
	FAudioSourceVoice_Start(songVoice, 0, 0);
	return stb_vorbis_stream_length_in_seconds(activeSong);
}